

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_2::Indent::delimit
          (StringTree *__return_storage_ptr__,Indent *this,Array<kj::StringTree> *items,
          PrintMode mode,PrintKind kind)

{
  bool bVar1;
  ulong size;
  Array<kj::StringTree> *pAVar2;
  undefined4 in_register_00000084;
  ArrayPtr<char> AVar3;
  char *local_158;
  undefined1 local_f9;
  ArrayPtr<const_char> local_f8;
  StringTree local_e8;
  char *local_b0;
  char *local_a8;
  char *delim;
  undefined1 local_90 [8];
  ArrayPtr<char> delimArrayPtr;
  Array<char> delimArrayPtr_heap;
  char delimArrayPtr_stack [32];
  bool delimArrayPtr_isOnStack;
  size_t delimArrayPtr_size;
  PrintKind local_28;
  PrintMode local_24;
  PrintKind kind_local;
  PrintMode mode_local;
  Array<kj::StringTree> *items_local;
  Indent *this_local;
  
  local_28 = kind;
  local_24 = mode;
  _kind_local = items;
  items_local = (Array<kj::StringTree> *)this;
  this_local = (Indent *)__return_storage_ptr__;
  if ((this->amount == 0) || (bVar1 = canPrintAllInline(items,kind), bVar1)) {
    pAVar2 = kj::mv<kj::Array<kj::StringTree>>(items);
    kj::StringPtr::StringPtr((StringPtr *)&delimArrayPtr_size,", ");
    kj::StringTree::StringTree(__return_storage_ptr__,pAVar2,(StringPtr)_delimArrayPtr_size);
  }
  else {
    size = (ulong)(this->amount * 2 + 3);
    if (size < 0x21) {
      kj::Array<char>::Array((Array<char> *)&delimArrayPtr.size_,(void *)0x0);
      AVar3 = kj::arrayPtr<char>((char *)&delimArrayPtr_heap.disposer,size);
    }
    else {
      kj::heapArray<char>((Array<char> *)&delimArrayPtr.size_,size);
      AVar3 = kj::Array::operator_cast_to_ArrayPtr((Array *)&delimArrayPtr.size_);
    }
    delimArrayPtr.ptr = (char *)AVar3.size_;
    local_90 = (undefined1  [8])AVar3.ptr;
    local_a8 = kj::ArrayPtr<char>::begin((ArrayPtr<char> *)local_90);
    *local_a8 = ',';
    local_a8[1] = '\n';
    memset(local_a8 + 2,0x20,(ulong)(this->amount << 1));
    local_a8[this->amount * 2 + 2] = '\0';
    if (local_24 == BARE) {
      local_158 = " ";
    }
    else {
      local_158 = local_a8 + 1;
    }
    local_b0 = local_158;
    pAVar2 = kj::mv<kj::Array<kj::StringTree>>(items);
    kj::StringPtr::StringPtr((StringPtr *)&local_f8,local_a8,(ulong)(this->amount * 2 + 2));
    kj::StringTree::StringTree(&local_e8,pAVar2,(StringPtr)local_f8);
    local_f9 = 0x20;
    kj::strTree<char_const*,kj::StringTree,char>
              (__return_storage_ptr__,(kj *)&local_b0,(char **)&local_e8,(StringTree *)&local_f9,
               (char *)CONCAT44(in_register_00000084,kind));
    kj::StringTree::~StringTree(&local_e8);
    kj::Array<char>::~Array((Array<char> *)&delimArrayPtr.size_);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree delimit(kj::Array<kj::StringTree> items, PrintMode mode, PrintKind kind) {
    if (amount == 0 || canPrintAllInline(items, kind)) {
      return kj::StringTree(kj::mv(items), ", ");
    } else {
      KJ_STACK_ARRAY(char, delimArrayPtr, amount * 2 + 3, 32, 256);
      auto delim = delimArrayPtr.begin();
      delim[0] = ',';
      delim[1] = '\n';
      memset(delim + 2, ' ', amount * 2);
      delim[amount * 2 + 2] = '\0';

      // If the outer value isn't being printed on its own line, we need to add a newline/indent
      // before the first item, otherwise we only add a space on the assumption that it is preceded
      // by an open bracket or parenthesis.
      return kj::strTree(mode == BARE ? " " : delim + 1,
          kj::StringTree(kj::mv(items), kj::StringPtr(delim, amount * 2 + 2)), ' ');
    }
  }